

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jinja2CppLight.h
# Opt level: O1

string * __thiscall
Jinja2CppLight::TupleValue::render_abi_cxx11_(string *__return_storage_ptr__,TupleValue *this)

{
  pointer psVar1;
  element_type *peVar2;
  pointer psVar3;
  bool bVar4;
  long *local_50 [2];
  long local_40 [2];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"{","");
  psVar3 = (this->values).
           super__Vector_base<std::shared_ptr<Jinja2CppLight::Value>,_std::allocator<std::shared_ptr<Jinja2CppLight::Value>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar1 = (this->values).
           super__Vector_base<std::shared_ptr<Jinja2CppLight::Value>,_std::allocator<std::shared_ptr<Jinja2CppLight::Value>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (psVar3 != psVar1) {
    bVar4 = true;
    do {
      if (bVar4) {
        bVar4 = false;
      }
      else {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      peVar2 = (psVar3->super___shared_ptr<Jinja2CppLight::Value,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr;
      if (peVar2 == (element_type *)0x0) {
        local_50[0] = local_40;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"<empty>","");
      }
      else {
        (*peVar2->_vptr_Value[2])((string *)local_50);
      }
      std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_50[0]);
      if (local_50[0] != local_40) {
        operator_delete(local_50[0],local_40[0] + 1);
      }
      psVar3 = psVar3 + 1;
    } while (psVar3 != psVar1);
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

virtual std::string render() {
        std::string result = "{";
        bool isFirst = true;

        for (auto& val : values) {
            if (isFirst)
                isFirst = false;
            else
                result += ", ";

            result += val ? val->render() : "<empty>";
        }

        result += "}";
        return result;
    }